

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsops.c
# Opt level: O1

LispPTR LCinit(void)

{
  uint uVar1;
  LispPTR LVar2;
  DLword *pDVar3;
  
  atom_instance = get_package_atom("instance",8,"INTERLISP",9,0);
  atom_class = get_package_atom("class",5,"INTERLISP",9,0);
  atom_annotatedValue = get_package_atom("annotatedValue",0xe,"INTERLISP",9,0);
  atom_FetchMethodOrHelp_LCUFN = get_package_atom("\\FetchMethodOrHelp-LCUFN",0x18,"INTERLISP",9,0);
  atom_FetchMethod_LCUFN = get_package_atom("\\FetchMethod-LCUFN",0x12,"INTERLISP",9,0);
  atom_FindVarIndex_LCUFN = get_package_atom("\\FindVarIndex-LCUFN",0x13,"INTERLISP",9,0);
  atom_GetIVValue_LCUFN = get_package_atom("\\GetIVValue-LCUFN",0x11,"INTERLISP",9,0);
  atom_PutIVValue_LCUFN = get_package_atom("\\PutIVValue-LCUFN",0x11,"INTERLISP",9,0);
  LVar2 = get_package_atom("*Global-Method-Cache*",0x15,"INTERLISP",9,0);
  pDVar3 = AtomSpace;
  if ((LVar2 & 0xfff0000) == 0) {
    LVar2 = get_package_atom("*Global-Method-Cache*",0x15,"INTERLISP",9,0);
    pDVar3 = pDVar3 + (ulong)(LVar2 * 5) * 2;
  }
  else {
    LVar2 = get_package_atom("*Global-Method-Cache*",0x15,"INTERLISP",9,0);
    if ((LVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)LVar2);
    }
    pDVar3 = Lisp_world + LVar2;
  }
  uVar1 = *(uint *)(pDVar3 + 2);
  if ((uVar1 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar1);
  }
  LCMethodCache = (LCMethodCacheEntry *)(Lisp_world + uVar1);
  LVar2 = get_package_atom("*Global-IV-Cache-Block*",0x17,"INTERLISP",9,0);
  pDVar3 = AtomSpace;
  if ((LVar2 & 0xfff0000) == 0) {
    LVar2 = get_package_atom("*Global-IV-Cache-Block*",0x17,"INTERLISP",9,0);
    pDVar3 = pDVar3 + (ulong)(LVar2 * 5) * 2;
  }
  else {
    LVar2 = get_package_atom("*Global-IV-Cache-Block*",0x17,"INTERLISP",9,0);
    if ((LVar2 & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)LVar2);
    }
    pDVar3 = Lisp_world + LVar2;
  }
  uVar1 = *(uint *)(pDVar3 + 2);
  if ((uVar1 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar1);
  }
  LCIVCache = (LCIVCacheEntry *)(Lisp_world + uVar1);
  return 0;
}

Assistant:

LispPTR LCinit(void) {
  atom_instance = GET_IL_ATOM("instance");
  atom_class = GET_IL_ATOM("class");
  atom_annotatedValue = GET_IL_ATOM("annotatedValue");
  atom_FetchMethodOrHelp_LCUFN = GET_IL_ATOM("\\FetchMethodOrHelp-LCUFN");
  atom_FetchMethod_LCUFN = GET_IL_ATOM("\\FetchMethod-LCUFN");
  atom_FindVarIndex_LCUFN = GET_IL_ATOM("\\FindVarIndex-LCUFN");
  atom_GetIVValue_LCUFN = GET_IL_ATOM("\\GetIVValue-LCUFN");
  atom_PutIVValue_LCUFN = GET_IL_ATOM("\\PutIVValue-LCUFN");
  LCMethodCache = (struct LCMethodCacheEntry *)AtomValPtr(GET_IL_ATOM("*Global-Method-Cache*"));
  LCIVCache = (struct LCIVCacheEntry *)AtomValPtr(GET_IL_ATOM("*Global-IV-Cache-Block*"));
  return NIL_PTR; /* in case called from lisp */
}